

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextInput.cpp
# Opt level: O1

bool __thiscall cursespp::TextInput::Write(TextInput *this,string *key)

{
  string *psVar1;
  utf8 *this_00;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  back_insert_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  in_RCX;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var12;
  const_iterator it;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  size_t local_70;
  wchar_t local_68;
  undefined4 uStack_64;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58._M_current = (key->_M_dataplus)._M_p;
  if ((long)key->_M_string_length < 1) {
    iVar10 = 0;
  }
  else {
    _Var12._M_current = local_58._M_current + key->_M_string_length;
    iVar10 = 0;
    do {
      utf8::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(&local_58,_Var12);
      iVar10 = iVar10 + 1;
    } while (local_58._M_current < _Var12._M_current);
  }
  if ((iVar10 == 1) || ((iVar6 = 0, 1 < iVar10 && (this->inputMode == InputRaw)))) {
    if (this->inputMode == InputRaw) {
      _Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((this->rawBlacklist).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->rawBlacklist).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,key);
      if (_Var5._M_current !=
          (this->rawBlacklist).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        iVar6 = 0;
        goto LAB_0018327a;
      }
      std::__cxx11::string::_M_assign((string *)&this->buffer);
      this->bufferLength = (long)iVar10;
      this->position = iVar10;
    }
    else {
      if (this->truncate == true) {
        local_70 = 0;
        local_68 = L'\0';
        this_00 = (utf8 *)(this->buffer)._M_dataplus._M_p;
        local_78._M_current = (char *)&local_68;
        utf8::
        utf8to16<std::back_insert_iterator<std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  (this_00,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(this_00 + (this->buffer)._M_string_length),
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )&local_78,in_RCX);
        iVar4 = wcswidth((wchar_t *)local_78._M_current,local_70);
        sVar2 = (this->buffer)._M_string_length;
        if ((wchar_t *)local_78._M_current != &local_68) {
          operator_delete(local_78._M_current,CONCAT44(uStack_64,local_68) * 4 + 4);
        }
        iVar6 = 0;
        iVar11 = iVar4;
        if (iVar4 < 1) {
          iVar11 = iVar6;
        }
        iVar8 = (int)sVar2;
        if (0 < iVar4) {
          iVar8 = iVar11;
        }
        iVar4 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x16])(this);
        if (iVar4 <= iVar8) goto LAB_0018327a;
      }
      psVar1 = &this->buffer;
      if ((this->buffer)._M_string_length == 0) {
        uVar7 = 0xffffffffffffffff;
      }
      else {
        iVar6 = this->position;
        local_78._M_current = (psVar1->_M_dataplus)._M_p;
        if (0 < iVar6) {
          do {
            if (local_78._M_current ==
                (this->buffer)._M_dataplus._M_p + (this->buffer)._M_string_length) break;
            utf8::unchecked::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (&local_78);
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
        }
        uVar7 = (long)local_78._M_current - (long)(psVar1->_M_dataplus)._M_p;
      }
      uVar9 = 0;
      if (uVar7 == 0xffffffffffffffff) {
        uVar7 = uVar9;
      }
      std::__cxx11::string::replace((ulong)psVar1,uVar7,(char *)0x0,(ulong)(key->_M_dataplus)._M_p);
      local_78._M_current = (this->buffer)._M_dataplus._M_p;
      sVar2 = (this->buffer)._M_string_length;
      if (0 < (long)sVar2) {
        _Var12._M_current = local_78._M_current + sVar2;
        uVar9 = 0;
        do {
          utf8::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (&local_78,_Var12);
          uVar9 = uVar9 + 1;
        } while (local_78._M_current < _Var12._M_current);
      }
      this->bufferLength = uVar9;
      this->position = this->position + iVar10;
    }
    pcVar3 = (this->buffer)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + (this->buffer)._M_string_length);
    sigslot::
    signal2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
    ::operator()(&this->TextChanged,this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[5])(this);
    iVar6 = 1;
  }
LAB_0018327a:
  return SUB41(iVar6,0);
}

Assistant:

bool TextInput::Write(const std::string& key) {
    /* one character at a time. if it's more than one character, we're
    dealing with an escape sequence and should not print it unless
    the input mode allows for modifiers */
    int len = u8len(key);
    if (len == 1 || (len > 1 && this->inputMode == InputRaw)) {
        if (this->inputMode == InputRaw) {
            auto& bl = this->rawBlacklist;
            if (std::find(bl.begin(), bl.end(), key) != bl.end()) {
                return false;
            }
            this->buffer = key;
            this->bufferLength = len;
            this->position = len;
        }
        else {
            if (truncate) {
                int cols = u8cols(this->buffer);
                if (cols >= this->GetWidth()) {
                    return false;
                }
            }

            size_t offset = u8offset(this->buffer, this->position);
            offset = (offset == std::string::npos) ? 0 : offset;
            this->buffer.insert(offset, key);
            this->bufferLength = u8len(buffer);
            this->position += len;
        }

        this->TextChanged(this, this->buffer);
        this->Redraw();
        return true;
    }

    return false;
}